

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void ts_tree_edit(TSTree *self,TSInputEdit *edit)

{
  TSRange *pTVar1;
  TSPoint TVar2;
  Subtree SVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  uint uVar8;
  SubtreePool pool;
  
  lVar6 = 0x14;
  for (uVar7 = 0; uVar7 < self->included_range_count; uVar7 = uVar7 + 1) {
    pTVar1 = self->included_ranges;
    uVar8 = *(uint *)((long)&(pTVar1->start_point).row + lVar6);
    if (edit->old_end_byte <= uVar8) {
      if (uVar8 != 0xffffffff) {
        uVar8 = (uVar8 - edit->old_end_byte) + edit->new_end_byte;
        *(uint *)((long)&(pTVar1->start_point).row + lVar6) = uVar8;
        TVar2 = point_sub(*(TSPoint *)((long)pTVar1 + lVar6 + -0xc),edit->old_end_point);
        uVar4 = (long)edit->new_end_point + (long)TVar2;
        uVar5 = uVar4 & 0xffffffff | (ulong)TVar2 & 0xffffffff00000000;
        if (TVar2.row == 0) {
          uVar5 = uVar4;
        }
        *(ulong *)((long)pTVar1 + lVar6 + -0xc) = uVar5;
        if (uVar8 < edit->new_end_byte) {
          *(undefined4 *)((long)&(pTVar1->start_point).row + lVar6) = 0xffffffff;
          *(undefined8 *)((long)pTVar1 + lVar6 + -0xc) = 0xffffffffffffffff;
        }
      }
      uVar8 = *(uint *)((long)pTVar1 + lVar6 + -4);
      if (edit->old_end_byte <= uVar8) {
        uVar8 = (uVar8 - edit->old_end_byte) + edit->new_end_byte;
        *(uint *)((long)pTVar1 + lVar6 + -4) = uVar8;
        TVar2 = point_sub(*(TSPoint *)((long)pTVar1 + lVar6 + -0x14),edit->old_end_point);
        uVar4 = (long)edit->new_end_point + (long)TVar2;
        uVar5 = uVar4 & 0xffffffff | (ulong)TVar2 & 0xffffffff00000000;
        if (TVar2.row == 0) {
          uVar5 = uVar4;
        }
        *(ulong *)((long)pTVar1 + lVar6 + -0x14) = uVar5;
        if (uVar8 < edit->new_end_byte) {
          *(undefined4 *)((long)pTVar1 + lVar6 + -4) = 0xffffffff;
          *(undefined8 *)((long)pTVar1 + lVar6 + -0x14) = 0xffffffffffffffff;
        }
      }
    }
    lVar6 = lVar6 + 0x18;
  }
  ts_subtree_pool_new(&pool,0);
  SVar3 = ts_subtree_edit(*(SubtreeInlineData *)&self->root,edit,&pool);
  self->root = SVar3;
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete(&pool);
  return;
}

Assistant:

void ts_tree_edit(TSTree *self, const TSInputEdit *edit) {
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *range = &self->included_ranges[i];
    if (range->end_byte >= edit->old_end_byte) {
      if (range->end_byte != UINT32_MAX) {
        range->end_byte = edit->new_end_byte + (range->end_byte - edit->old_end_byte);
        range->end_point = point_add(
          edit->new_end_point,
          point_sub(range->end_point, edit->old_end_point)
        );
        if (range->end_byte < edit->new_end_byte) {
          range->end_byte = UINT32_MAX;
          range->end_point = POINT_MAX;
        }
      }
      if (range->start_byte >= edit->old_end_byte) {
        range->start_byte = edit->new_end_byte + (range->start_byte - edit->old_end_byte);
        range->start_point = point_add(
          edit->new_end_point,
          point_sub(range->start_point, edit->old_end_point)
        );
        if (range->start_byte < edit->new_end_byte) {
          range->start_byte = UINT32_MAX;
          range->start_point = POINT_MAX;
        }
      }
    }
  }

  SubtreePool pool = ts_subtree_pool_new(0);
  self->root = ts_subtree_edit(self->root, edit, &pool);
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete(&pool);
}